

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl2.cpp
# Opt level: O1

void E64::sdl2_wait_until_r_released(void)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  SDL_Event event;
  timespec local_70;
  int local_60 [5];
  int local_4c;
  
  bVar3 = true;
  do {
    SDL_PollEvent(local_60);
    if (local_4c == 0x72 && local_60[0] == 0x301) {
      bVar3 = false;
    }
    local_70.tv_sec = 0;
    local_70.tv_nsec = 40000000;
    do {
      iVar1 = nanosleep(&local_70,&local_70);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void E64::sdl2_wait_until_r_released()
{
    SDL_Event event;
    bool wait = true;
    while(wait) {
        SDL_PollEvent(&event);
        if( (event.type == SDL_KEYUP) && (event.key.keysym.sym == SDLK_r) ) wait = false;
        std::this_thread::sleep_for(std::chrono::microseconds(40000));
    }
}